

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.cpp
# Opt level: O0

void fmt_PrintString(char *buf,size_t bufLen,FormatSpec *fmt,char *value)

{
  bool bVar1;
  ulong local_58;
  ulong local_50;
  size_t i_1;
  size_t i;
  size_t padLen;
  size_t totalLen;
  size_t len;
  char *value_local;
  FormatSpec *fmt_local;
  size_t bufLen_local;
  char *buf_local;
  
  if (fmt->sign != 0) {
    error("Formatting string with sign flag \'%c\'\n",(ulong)(uint)fmt->sign);
  }
  if ((fmt->prefix & 1U) != 0) {
    error("Formatting string with prefix flag \'#\'\n");
  }
  if ((fmt->padZero & 1U) != 0) {
    error("Formatting string with padding flag \'0\'\n");
  }
  if ((fmt->hasFrac & 1U) != 0) {
    error("Formatting string with fractional width\n");
  }
  if (fmt->type != 0x73) {
    error("Formatting string as type \'%c\'\n",(ulong)(uint)fmt->type);
  }
  totalLen = strlen(value);
  local_58 = totalLen;
  if (totalLen < fmt->width) {
    local_58 = fmt->width;
  }
  padLen = local_58;
  if (bufLen - 1 < local_58) {
    error("Formatted string value too long\n");
    padLen = bufLen - 1;
    if (padLen < totalLen) {
      totalLen = padLen;
    }
  }
  bVar1 = false;
  if ((totalLen < bufLen) && (bVar1 = false, padLen < bufLen)) {
    bVar1 = totalLen <= padLen;
  }
  if (bVar1) {
    if ((fmt->alignLeft & 1U) == 0) {
      for (local_50 = 0; local_50 < padLen - totalLen; local_50 = local_50 + 1) {
        buf[local_50] = ' ';
      }
      memcpy(buf + (padLen - totalLen),value,totalLen);
    }
    else {
      memcpy(buf,value,totalLen);
      for (i_1 = totalLen; i_1 < padLen; i_1 = i_1 + 1) {
        buf[i_1] = ' ';
      }
    }
    buf[padLen] = '\0';
    return;
  }
  __assert_fail("len < bufLen && totalLen < bufLen && len <= totalLen",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/format.cpp"
                ,0x99,
                "void fmt_PrintString(char *, size_t, const struct FormatSpec *, const char *)");
}

Assistant:

void fmt_PrintString(char *buf, size_t bufLen, struct FormatSpec const *fmt, char const *value)
{
	if (fmt->sign)
		error("Formatting string with sign flag '%c'\n", fmt->sign);
	if (fmt->prefix)
		error("Formatting string with prefix flag '#'\n");
	if (fmt->padZero)
		error("Formatting string with padding flag '0'\n");
	if (fmt->hasFrac)
		error("Formatting string with fractional width\n");
	if (fmt->type != 's')
		error("Formatting string as type '%c'\n", fmt->type);

	size_t len = strlen(value);
	size_t totalLen = fmt->width > len ? fmt->width : len;

	if (totalLen > bufLen - 1) { // bufLen includes terminator
		error("Formatted string value too long\n");
		totalLen = bufLen - 1;
		if (len > totalLen)
			len = totalLen;
	}
	assert(len < bufLen && totalLen < bufLen && len <= totalLen);

	size_t padLen = totalLen - len;

	if (fmt->alignLeft) {
		memcpy(buf, value, len);
		for (size_t i = len; i < totalLen; i++)
			buf[i] = ' ';
	} else {
		for (size_t i = 0; i < padLen; i++)
			buf[i] = ' ';
		memcpy(buf + padLen, value, len);
	}

	buf[totalLen] = '\0';
}